

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application_glfw.cpp
# Opt level: O0

void __thiscall
Application::removeInputHandler(Application *this,shared_ptr<InputHandler> *inputHandler)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
  local_48;
  const_iterator local_40;
  const_iterator local_38;
  shared_ptr<InputHandler> *local_30;
  __normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
  first;
  shared_ptr<InputHandler> *inputHandler_local;
  Application *this_local;
  
  first._M_current = inputHandler;
  local_28._M_current =
       (shared_ptr<InputHandler> *)
       std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
       begin(&this->_inputHandlers);
  local_30 = (shared_ptr<InputHandler> *)
             std::
             vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
             ::end(&this->_inputHandlers);
  local_20 = std::
             remove<__gnu_cxx::__normal_iterator<std::shared_ptr<InputHandler>*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>,std::shared_ptr<InputHandler>>
                       (local_28,(__normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
                                  )local_30,inputHandler);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<InputHandler>const*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>
  ::__normal_iterator<std::shared_ptr<InputHandler>*>
            ((__normal_iterator<std::shared_ptr<InputHandler>const*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>
              *)&local_38,&local_20);
  local_48._M_current =
       (shared_ptr<InputHandler> *)
       std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
       end(&this->_inputHandlers);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<InputHandler>const*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>
  ::__normal_iterator<std::shared_ptr<InputHandler>*>
            ((__normal_iterator<std::shared_ptr<InputHandler>const*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>
              *)&local_40,&local_48);
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::erase
            (&this->_inputHandlers,local_38,local_40);
  peVar1 = std::__shared_ptr_access<InputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )inputHandler);
  (*peVar1->_vptr_InputHandler[2])(peVar1,this->_window);
  return;
}

Assistant:

void Application::removeInputHandler(std::shared_ptr<InputHandler> inputHandler) {
    auto first = std::remove(_inputHandlers.begin(), _inputHandlers.end(), inputHandler);
    _inputHandlers.erase(first, _inputHandlers.end());
    inputHandler->removed(_window);
}